

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O3

int x509_crt_verifycrl(mbedtls_x509_crt *crt,mbedtls_x509_crt *ca,mbedtls_x509_crl *crl_list,
                      mbedtls_x509_crt_profile *profile)

{
  mbedtls_md_type_t md_alg;
  mbedtls_pk_type_t type;
  size_t __n;
  void *options;
  uint uVar1;
  uint uVar2;
  byte bVar3;
  int iVar4;
  mbedtls_md_info_t *md_info;
  uint uVar5;
  uchar hash [64];
  
  if (crl_list == (mbedtls_x509_crl *)0x0) {
    uVar5 = 0;
  }
  else {
    uVar5 = 0;
    do {
      while (((crl_list->version != 0 &&
              (__n = (crl_list->issuer_raw).len, __n == (ca->subject_raw).len)) &&
             (iVar4 = bcmp((crl_list->issuer_raw).p,(ca->subject_raw).p,__n), iVar4 == 0))) {
        if (((ca->ext_types & 4) != 0) && ((ca->key_usage & 0x8003) != 2)) {
LAB_00124570:
          return uVar5 | 0x10;
        }
        uVar1 = uVar5 | 0x20000;
        if ((profile->allowed_mds >> (crl_list->sig_md - MBEDTLS_MD_MD2 & 0x1f) & 1) != 0) {
          uVar1 = uVar5;
        }
        uVar5 = uVar1 | 0x40000;
        if ((profile->allowed_pks >> ((byte)((char)crl_list->sig_pk - MBEDTLS_PK_RSA) & 0x1f) & 1)
            != 0) {
          uVar5 = uVar1;
        }
        md_info = mbedtls_md_info_from_type(crl_list->sig_md);
        if (md_info == (mbedtls_md_info_t *)0x0) goto LAB_00124570;
        mbedtls_md(md_info,(crl_list->tbs).p,(crl_list->tbs).len,hash);
        iVar4 = x509_profile_check_key(profile,crl_list->sig_pk,&ca->pk);
        uVar1 = uVar5 | 0x10000;
        if (iVar4 == 0) {
          uVar1 = uVar5;
        }
        md_alg = crl_list->sig_md;
        type = crl_list->sig_pk;
        options = crl_list->sig_opts;
        bVar3 = mbedtls_md_get_size(md_info);
        iVar4 = mbedtls_pk_verify_ext
                          (type,options,&ca->pk,md_alg,hash,(ulong)bVar3,(crl_list->sig).p,
                           (crl_list->sig).len);
        if (iVar4 != 0) {
          return uVar1 | 0x10;
        }
        iVar4 = mbedtls_x509_time_is_past(&crl_list->next_update);
        uVar2 = uVar1 | 0x20;
        if (iVar4 == 0) {
          uVar2 = uVar1;
        }
        iVar4 = mbedtls_x509_time_is_future(&crl_list->this_update);
        uVar5 = uVar2 | 0x400;
        if (iVar4 == 0) {
          uVar5 = uVar2;
        }
        iVar4 = mbedtls_x509_crt_is_revoked(crt,crl_list);
        if (iVar4 != 0) {
          return uVar5 | 2;
        }
        crl_list = crl_list->next;
        if (crl_list == (mbedtls_x509_crl *)0x0) {
          return uVar5;
        }
      }
      crl_list = crl_list->next;
    } while (crl_list != (mbedtls_x509_crl *)0x0);
  }
  return uVar5;
}

Assistant:

static int x509_crt_verifycrl( mbedtls_x509_crt *crt, mbedtls_x509_crt *ca,
                               mbedtls_x509_crl *crl_list,
                               const mbedtls_x509_crt_profile *profile )
{
    int flags = 0;
    unsigned char hash[MBEDTLS_MD_MAX_SIZE];
    const mbedtls_md_info_t *md_info;

    if( ca == NULL )
        return( flags );

    while( crl_list != NULL )
    {
        if( crl_list->version == 0 ||
            crl_list->issuer_raw.len != ca->subject_raw.len ||
            memcmp( crl_list->issuer_raw.p, ca->subject_raw.p,
                    crl_list->issuer_raw.len ) != 0 )
        {
            crl_list = crl_list->next;
            continue;
        }

        /*
         * Check if the CA is configured to sign CRLs
         */
#if defined(MBEDTLS_X509_CHECK_KEY_USAGE)
        if( mbedtls_x509_crt_check_key_usage( ca, MBEDTLS_X509_KU_CRL_SIGN ) != 0 )
        {
            flags |= MBEDTLS_X509_BADCRL_NOT_TRUSTED;
            break;
        }
#endif

        /*
         * Check if CRL is correctly signed by the trusted CA
         */
        if( x509_profile_check_md_alg( profile, crl_list->sig_md ) != 0 )
            flags |= MBEDTLS_X509_BADCRL_BAD_MD;

        if( x509_profile_check_pk_alg( profile, crl_list->sig_pk ) != 0 )
            flags |= MBEDTLS_X509_BADCRL_BAD_PK;

        md_info = mbedtls_md_info_from_type( crl_list->sig_md );
        if( md_info == NULL )
        {
            /*
             * Cannot check 'unknown' hash
             */
            flags |= MBEDTLS_X509_BADCRL_NOT_TRUSTED;
            break;
        }

        mbedtls_md( md_info, crl_list->tbs.p, crl_list->tbs.len, hash );

        if( x509_profile_check_key( profile, crl_list->sig_pk, &ca->pk ) != 0 )
            flags |= MBEDTLS_X509_BADCERT_BAD_KEY;

        if( mbedtls_pk_verify_ext( crl_list->sig_pk, crl_list->sig_opts, &ca->pk,
                           crl_list->sig_md, hash, mbedtls_md_get_size( md_info ),
                           crl_list->sig.p, crl_list->sig.len ) != 0 )
        {
            flags |= MBEDTLS_X509_BADCRL_NOT_TRUSTED;
            break;
        }

        /*
         * Check for validity of CRL (Do not drop out)
         */
        if( mbedtls_x509_time_is_past( &crl_list->next_update ) )
            flags |= MBEDTLS_X509_BADCRL_EXPIRED;

        if( mbedtls_x509_time_is_future( &crl_list->this_update ) )
            flags |= MBEDTLS_X509_BADCRL_FUTURE;

        /*
         * Check if certificate is revoked
         */
        if( mbedtls_x509_crt_is_revoked( crt, crl_list ) )
        {
            flags |= MBEDTLS_X509_BADCERT_REVOKED;
            break;
        }

        crl_list = crl_list->next;
    }

    return( flags );
}